

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  ImDrawList *draw_list;
  ImVec2 IVar4;
  uint3 uVar5;
  undefined1 auVar6 [16];
  ImGuiContext *pIVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ImU32 id;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar16;
  size_t sVar17;
  undefined8 extraout_RAX;
  char *pcVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ImGuiCol idx;
  long lVar22;
  ImGuiTabItem *pIVar23;
  int iVar24;
  ImGuiWindow *pIVar25;
  undefined1 uVar26;
  uint flags_00;
  undefined1 auVar27 [4];
  float fVar28;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar29;
  bool text_clipped;
  bool just_closed;
  ulong local_b0;
  ImRect bb;
  bool held;
  float local_6c;
  undefined1 local_68 [4];
  undefined1 auStack_64 [12];
  bool *local_58;
  bool hovered;
  float fStack_4c;
  int local_44;
  char *local_40;
  ImGuiWindow *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar7 = GImGui;
  local_38 = GImGui->CurrentWindow;
  if (local_38->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,id,(ImRect *)0x0,0x18);
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                    ,0x1ef8,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)")
      ;
    }
  }
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                  ,0x1ef9,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  local_58 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_58 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar4 = TabItemCalcSize(label,local_58 != (bool *)0x0);
  auVar27 = (undefined1  [4])IVar4.x;
  uVar12 = (tab_bar->Tabs).Size;
  unique0x1000017c = extraout_XMM0_Dc;
  local_68 = (undefined1  [4])IVar4.x;
  auStack_64._0_4_ = IVar4.y;
  unique0x10000180 = extraout_XMM0_Dd;
  local_40 = label;
  if (0 < (int)uVar12 && id != 0) {
    pIVar16 = (tab_bar->Tabs).Data;
    lVar22 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar16->ID + lVar22) == id) {
        pIVar23 = (ImGuiTabItem *)((long)&pIVar16->ID + lVar22);
        local_b0 = local_b0 & 0xffffffff00000000;
        goto LAB_0018b621;
      }
      lVar22 = lVar22 + 0x28;
    } while ((ulong)uVar12 * 0x28 != lVar22);
  }
  if (uVar12 == (tab_bar->Tabs).Capacity) {
    if (uVar12 == 0) {
      iVar19 = 8;
    }
    else {
      iVar19 = (int)uVar12 / 2 + uVar12;
    }
    iVar21 = uVar12 + 1;
    if ((int)(uVar12 + 1) < iVar19) {
      iVar21 = iVar19;
    }
    pIVar16 = (ImGuiTabItem *)MemAlloc((long)iVar21 * 0x28);
    pIVar23 = (tab_bar->Tabs).Data;
    if (pIVar23 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar16,pIVar23,(long)(tab_bar->Tabs).Size * 0x28);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar16;
    (tab_bar->Tabs).Capacity = iVar21;
    uVar12 = (tab_bar->Tabs).Size;
    auVar27 = local_68;
  }
  else {
    pIVar16 = (tab_bar->Tabs).Data;
  }
  pIVar16[(int)uVar12].ID = 0;
  pIVar16[(int)uVar12].Flags = 0;
  pIVar16[(int)uVar12].LastFrameVisible = -1;
  pIVar16[(int)uVar12].LastFrameSelected = -1;
  pIVar16[(int)uVar12].Offset = 0.0;
  pIVar16[(int)uVar12].Width = 0.0;
  pIVar16[(int)uVar12].ContentWidth = 0.0;
  pIVar23 = pIVar16 + (int)uVar12;
  pIVar23->NameOffset = -1;
  pIVar23->BeginOrder = -1;
  pIVar23->IndexDuringLayout = -1;
  *(undefined4 *)&pIVar16[(int)uVar12].WantClose = 0;
  iVar19 = (tab_bar->Tabs).Size;
  uVar12 = iVar19 + 1;
  (tab_bar->Tabs).Size = uVar12;
  if (iVar19 < 0) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                  ,0x70b,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
  }
  pIVar16 = (tab_bar->Tabs).Data;
  uVar20 = (ulong)uVar12;
  pIVar23 = pIVar16 + (uVar20 - 1);
  pIVar23->ID = id;
  pIVar16[uVar20 - 1].Width = (float)auVar27;
  tab_bar->TabsAddedNew = true;
  local_b0 = CONCAT44(local_b0._4_4_,(int)CONCAT71((int7)(uVar20 * 5 >> 8),1));
LAB_0018b621:
  pcVar8 = local_40;
  if ((pIVar23 < pIVar16) || (pIVar16 + (int)uVar12 <= pIVar23)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                  ,0x722,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar23 - (int)pIVar16) >> 3) * -0x3333;
  pIVar23->ContentWidth = (float)auVar27;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  pIVar23->BeginOrder = sVar3;
  uVar12 = tab_bar->Flags;
  iVar13 = tab_bar->PrevFrameVisible + 1;
  iVar19 = pIVar7->FrameCount;
  iVar24 = pIVar23->LastFrameVisible + 1;
  pIVar23->LastFrameVisible = iVar19;
  pIVar23->Flags = flags_00;
  iVar21 = (tab_bar->TabsNames).Buf.Size;
  iVar14 = iVar21 + -1;
  if (iVar21 == 0) {
    iVar14 = 0;
  }
  pIVar23->NameOffset = iVar14;
  sVar17 = strlen(local_40);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar8,pcVar8 + sVar17 + 1);
  pIVar25 = local_38;
  if (((iVar24 < iVar19) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar13 < iVar19) {
      if ((flags_00 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_0018b710;
    }
    else if ((flags_00 >> 0x15 & 1) == 0) {
LAB_0018b710:
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar5 = (uint3)(flags_00 >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar20 = CONCAT71((uint7)uVar5,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar13 < iVar19) && ((tab_bar->Tabs).Size == 1)) {
    uVar20 = (ulong)CONCAT31(uVar5,(tab_bar->Flags & 2) == 0);
  }
  else {
    uVar20 = 0;
  }
  bVar11 = SUB81(uVar20,0);
  if ((((byte)local_b0 | iVar19 <= iVar13) & iVar24 < iVar19) == 1) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return (bool)((flags_00 >> 0x15 & 1) == 0 & bVar11);
  }
  local_b0 = CONCAT44(local_b0._4_4_,iVar24);
  if (tab_bar->SelectedTabId == id) {
    pIVar23->LastFrameSelected = pIVar7->FrameCount;
  }
  uVar15 = pIVar23->Flags;
  fVar2 = pIVar23->Width;
  fVar28 = pIVar23->Offset;
  if ((uVar15 & 0xc0) == 0) {
    fVar28 = (float)(int)(fVar28 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar28 + (tab_bar->BarRect).Min.x;
  IVar4 = (local_38->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar29.y = bb.Min.y;
  IVar29.x = bb.Min.x;
  (local_38->DC).CursorPos = IVar29;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_64._0_4_ + bb.Min.y;
  local_44 = iVar19;
  if ((uVar15 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_0018b858;
    fStack_4c = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_6c = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_68 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_0018b858:
    auVar6._12_4_ = 0;
    auVar6._0_12_ = auStack_64;
    _local_68 = auVar6 << 0x20;
  }
  _hovered = bb.Max.x - bb.Min.x;
  fStack_4c = bb.Max.y - bb.Min.y;
  IVar29 = (pIVar25->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(pIVar7->Style).FramePadding.y);
  (pIVar25->DC).CursorMaxPos = IVar29;
  bVar9 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!bVar9) {
    if (local_68[0] != '\0') {
      PopClipRect();
    }
    (pIVar25->DC).CursorPos = IVar4;
    return bVar11;
  }
  uVar15 = flags_00 & 0x200000;
  bVar9 = ButtonBehavior(&bb,id,&hovered,&held,
                         (uVar15 >> 0x11) + (uint)pIVar7->DragDropActive * 0x200 + 0x1010);
  if ((bVar9) && (uVar15 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (pIVar7->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (local_44 <= (int)local_b0)) &&
       (bVar10 = IsMouseDragging(0,-1.0), bVar10)) &&
      ((pIVar7->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar2 = (pIVar7->IO).MouseDelta.x, fVar2 < 0.0 &&
       (pIVar1 = &(pIVar7->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar2 && (bb.Max.x < (pIVar7->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,pIVar23,(pIVar7->IO).MousePos);
  }
  draw_list = pIVar25->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (bVar11 == false) {
      idx = (uint)((uVar12 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar12 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  local_b0 = uVar20;
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar11 = IsItemHovered(0x20);
  pcVar8 = local_40;
  if (bVar11) {
    bVar11 = IsMouseClicked(1,false);
    if (bVar11) {
      uVar15 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar11 = IsMouseReleased(1);
      if (!bVar11) goto LAB_0018bae4;
    }
    if (uVar15 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_0018bae4:
  uVar12 = tab_bar->Flags;
  if (local_58 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
    pIVar25 = local_38;
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar12 >> 1 & 4 | flags_00,tab_bar->FramePadding,pcVar8,id,
             close_button_id,SUB81(local_b0,0),&just_closed,&text_clipped);
  if ((local_58 != (bool *)0x0) && (just_closed != false)) {
    *local_58 = false;
    TabBarCloseTab(tab_bar,pIVar23);
  }
  if (local_68[0] != '\0') {
    PopClipRect();
  }
  (pIVar25->DC).CursorPos = IVar4;
  uVar26 = (undefined1)local_b0;
  if ((((text_clipped == true) && (pIVar7->HoveredId == id)) && (held == false)) &&
     (((pIVar7->TooltipSlowDelay <= pIVar7->HoveredIdNotActiveTimer &&
        pIVar7->HoveredIdNotActiveTimer != pIVar7->TooltipSlowDelay &&
       (bVar11 = IsItemHovered(0), bVar11)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar23->Flags & 0x10) == 0)))))) {
    pcVar18 = FindRenderedTextEnd(pcVar8,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar18 - (int)pcVar8),pcVar8);
  }
  if (((flags_00 >> 0x15 & 1) != 0) && (uVar26 = bVar9, tab_bar->SelectedTabId == pIVar23->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                  ,0x1fae,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  return (bool)uVar26;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}